

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

void reset_entrance_data(chunk *c)

{
  dun_data *pdVar1;
  int **ppiVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  pdVar1 = dun;
  if (z_info->level_room_max != 0) {
    memset(dun->ent_n,0,(ulong)z_info->level_room_max << 2);
  }
  ppiVar2 = pdVar1->ent2room;
  if (ppiVar2 != (int **)0x0) {
    piVar3 = *ppiVar2;
    if (piVar3 != (int *)0x0) {
      lVar5 = 8;
      do {
        mem_free(piVar3);
        ppiVar2 = dun->ent2room;
        piVar3 = *(int **)((long)ppiVar2 + lVar5);
        lVar5 = lVar5 + 8;
      } while (piVar3 != (int *)0x0);
    }
    mem_free(ppiVar2);
  }
  ppiVar2 = (int **)mem_alloc((long)c->height * 8 + 8);
  dun->ent2room = ppiVar2;
  lVar5 = (long)c->height;
  if (0 < lVar5) {
    uVar4 = (ulong)(uint)c->width;
    lVar6 = 0;
    do {
      piVar3 = (int *)mem_alloc((long)(int)uVar4 << 2);
      dun->ent2room[lVar6] = piVar3;
      uVar4 = (ulong)(uint)c->width;
      if (L'\0' < c->width) {
        piVar3 = dun->ent2room[lVar6];
        lVar5 = 0;
        do {
          piVar3[lVar5] = -1;
          lVar5 = lVar5 + 1;
          uVar4 = (ulong)c->width;
        } while (lVar5 < (long)uVar4);
      }
      lVar6 = lVar6 + 1;
      lVar5 = (long)c->height;
    } while (lVar6 < lVar5);
    ppiVar2 = dun->ent2room;
  }
  ppiVar2[lVar5] = (int *)0x0;
  return;
}

Assistant:

static void reset_entrance_data(const struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_room_max; ++i) {
		dun->ent_n[i] = 0;
	}
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	/* Add a trailing NULL so the deallocation knows when to stop. */
	dun->ent2room = mem_alloc((c->height + 1) * sizeof(*dun->ent2room));
	for (i = 0; i < c->height; ++i) {
		int j;

		dun->ent2room[i] =
			mem_alloc(c->width * sizeof(*dun->ent2room[i]));
		for (j = 0; j < c->width; ++j) {
			dun->ent2room[i][j] = -1;
		}
	}
	dun->ent2room[c->height] = NULL;
}